

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  jpgd_block_t *pjVar6;
  short *psVar7;
  int in_ESI;
  long in_RDI;
  jpgd_block_t *this_coef_1;
  jpgd_block_t *this_coef;
  uint idx;
  jpgd_block_t *p;
  int m1;
  int p1;
  int r;
  int k;
  int s;
  undefined8 in_stack_ffffffffffffffb8;
  jpgd_status status;
  jpeg_decoder *in_stack_ffffffffffffffc0;
  int num_bits;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  jpeg_decoder *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe0;
  uint local_18;
  
  uVar1 = 1 << ((byte)*(undefined4 *)(in_RDI + 0x23c) & 0x1f);
  uVar2 = -1 << ((byte)*(undefined4 *)(in_RDI + 0x23c) & 0x1f);
  pjVar6 = coeff_buf_getp(in_stack_ffffffffffffffd0,
                          (coeff_buf *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                          ,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (int)in_stack_ffffffffffffffc0);
  status = (jpgd_status)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (0x3f < *(int *)(in_RDI + 0x238)) {
    stop_decoding(in_stack_ffffffffffffffc0,status);
  }
  uVar5 = *(uint *)(in_RDI + 0x234);
  if (*(int *)(in_RDI + 800) == 0) {
    for (; (int)uVar5 <= *(int *)(in_RDI + 0x238); uVar5 = uVar5 + 1) {
      in_stack_ffffffffffffffcc = *(uint *)(in_RDI + 0x224 + (long)in_ESI * 4);
      if (7 < in_stack_ffffffffffffffcc) {
        stop_decoding(in_stack_ffffffffffffffc0,status);
      }
      uVar3 = huff_decode((jpeg_decoder *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),
                          (huff_tables *)CONCAT44(uVar1,uVar2));
      in_stack_ffffffffffffffe0 = (int)uVar3 >> 4;
      num_bits = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      if ((uVar3 & 0xf) == 0) {
        if (in_stack_ffffffffffffffe0 != 0xf) {
          *(int *)(in_RDI + 800) = 1 << ((byte)in_stack_ffffffffffffffe0 & 0x1f);
          if (in_stack_ffffffffffffffe0 != 0) {
            uVar4 = get_bits_no_markers((jpeg_decoder *)
                                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ),num_bits);
            *(uint *)(in_RDI + 800) = uVar4 + *(int *)(in_RDI + 800);
          }
          break;
        }
        local_18 = 0;
      }
      else {
        if ((uVar3 & 0xf) != 1) {
          stop_decoding(in_stack_ffffffffffffffc0,status);
        }
        uVar4 = get_bits_no_markers((jpeg_decoder *)
                                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                    num_bits);
        local_18 = uVar2;
        if (uVar4 != 0) {
          local_18 = uVar1;
        }
      }
      do {
        in_stack_ffffffffffffffc0 =
             (jpeg_decoder *)(pjVar6 + *(int *)(g_ZAG + (long)(int)(uVar5 & 0x3f) * 4));
        if ((short)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf[0] == 0) {
          in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + -1;
          if (in_stack_ffffffffffffffe0 < 0) break;
        }
        else {
          uVar4 = get_bits_no_markers((jpeg_decoder *)
                                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                      (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
          if ((uVar4 != 0) &&
             (((int)(short)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf[0] & uVar1) == 0)) {
            if ((short)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf[0] < 0) {
              *(short *)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf =
                   (short)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf[0] + (short)uVar2;
            }
            else {
              *(short *)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf =
                   (short)in_stack_ffffffffffffffc0->m_jmp_state[0].__jmpbuf[0] + (short)uVar1;
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 <= *(int *)(in_RDI + 0x238));
      if ((local_18 != 0) && ((int)uVar5 < 0x40)) {
        pjVar6[*(int *)(g_ZAG + (long)(int)uVar5 * 4)] = (jpgd_block_t)local_18;
      }
    }
  }
  if (0 < *(int *)(in_RDI + 800)) {
    for (; (int)uVar5 <= *(int *)(in_RDI + 0x238); uVar5 = uVar5 + 1) {
      psVar7 = pjVar6 + *(int *)(g_ZAG + (long)(int)(uVar5 & 0x3f) * 4);
      if (((*psVar7 != 0) &&
          (uVar4 = get_bits_no_markers((jpeg_decoder *)
                                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                                       ,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)), uVar4 != 0
          )) && (((int)*psVar7 & uVar1) == 0)) {
        if (*psVar7 < 0) {
          *psVar7 = *psVar7 + (short)uVar2;
        }
        else {
          *psVar7 = *psVar7 + (short)uVar1;
        }
      }
    }
    *(int *)(in_RDI + 800) = *(int *)(in_RDI + 800) + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int s, k, r;

		int p1 = 1 << pD->m_successive_low;

		//int m1 = (-1) << pD->m_successive_low;
		int m1 = static_cast<int>((UINT32_MAX << pD->m_successive_low));

		jpgd_block_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
		if (pD->m_spectral_end > 63)
			pD->stop_decoding(JPGD_DECODE_ERROR);

		k = pD->m_spectral_start;

		if (pD->m_eob_run == 0)
		{
			for (; k <= pD->m_spectral_end; k++)
			{
				unsigned int idx = pD->m_comp_ac_tab[component_id];
				if (idx >= JPGD_MAX_HUFF_TABLES)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

				r = s >> 4;
				s &= 15;

				if (s)
				{
					if (s != 1)
						pD->stop_decoding(JPGD_DECODE_ERROR);

					if (pD->get_bits_no_markers(1))
						s = p1;
					else
						s = m1;
				}
				else
				{
					if (r != 15)
					{
						pD->m_eob_run = 1 << r;

						if (r)
							pD->m_eob_run += pD->get_bits_no_markers(r);

						break;
					}
				}

				do
				{
					jpgd_block_t* this_coef = p + g_ZAG[k & 63];

					if (*this_coef != 0)
					{
						if (pD->get_bits_no_markers(1))
						{
							if ((*this_coef & p1) == 0)
							{
								if (*this_coef >= 0)
									*this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
								else
									*this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
							}
						}
					}
					else
					{
						if (--r < 0)
							break;
					}

					k++;

				} while (k <= pD->m_spectral_end);

				if ((s) && (k < 64))
				{
					p[g_ZAG[k]] = static_cast<jpgd_block_t>(s);
				}
			}
		}

		if (pD->m_eob_run > 0)
		{
			for (; k <= pD->m_spectral_end; k++)
			{
				jpgd_block_t* this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

				if (*this_coef != 0)
				{
					if (pD->get_bits_no_markers(1))
					{
						if ((*this_coef & p1) == 0)
						{
							if (*this_coef >= 0)
								*this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
							else
								*this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
						}
					}
				}
			}

			pD->m_eob_run--;
		}
	}